

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsReadOnlyPointerKernel(Instruction *this)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  Instruction *this_01;
  
  uVar1 = type_id(this);
  if (uVar1 != 0) {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    uVar1 = type_id(this);
    this_01 = analysis::DefUseManager::GetDef(this_00,uVar1);
    if (this_01->opcode_ == OpTypePointer) {
      uVar1 = GetSingleWordInOperand(this_01,0);
      return uVar1 == 0;
    }
  }
  return false;
}

Assistant:

bool Instruction::IsReadOnlyPointerKernel() const {
  if (type_id() == 0) {
    return false;
  }

  Instruction* type_def = context()->get_def_use_mgr()->GetDef(type_id());
  if (type_def->opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class = spv::StorageClass(
      type_def->GetSingleWordInOperand(kPointerTypeStorageClassIndex));

  return storage_class == spv::StorageClass::UniformConstant;
}